

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofConstraint::getInfo2NonVirtual
          (btGeneric6DofConstraint *this,btConstraintInfo2 *info,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB)

{
  long in_RDI;
  btVector3 *unaff_retaddr;
  btTransform *in_stack_00000008;
  btTransform *in_stack_00000010;
  int in_stack_0000001c;
  btConstraintInfo2 *in_stack_00000020;
  btGeneric6DofConstraint *in_stack_00000028;
  int row_1;
  int row;
  int i;
  btTransform *in_stack_00000068;
  btGeneric6DofConstraint *in_stack_00000080;
  btVector3 *in_stack_000000b0;
  btVector3 *in_stack_000000b8;
  btVector3 *in_stack_000000c0;
  undefined8 in_stack_ffffffffffffff98;
  btGeneric6DofConstraint *in_stack_ffffffffffffffa0;
  undefined4 local_34;
  
  calculateTransforms((btGeneric6DofConstraint *)linVelA,(btTransform *)linVelB,_row);
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    testAngularLimitMotor(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20))
    ;
  }
  if ((*(byte *)(in_RDI + 0x52d) & 1) == 0) {
    setLinearLimits(in_stack_00000080,(btConstraintInfo2 *)angVelB,angVelA._4_4_,in_stack_00000068,
                    (btTransform *)this,(btVector3 *)info,in_stack_000000b0,in_stack_000000b8,
                    in_stack_000000c0);
    setAngularLimits(in_stack_00000028,in_stack_00000020,in_stack_0000001c,in_stack_00000010,
                     in_stack_00000008,unaff_retaddr,(btVector3 *)transA,(btVector3 *)info,
                     (btVector3 *)this);
  }
  else {
    setAngularLimits(in_stack_00000028,in_stack_00000020,in_stack_0000001c,in_stack_00000010,
                     in_stack_00000008,unaff_retaddr,(btVector3 *)transA,(btVector3 *)info,
                     (btVector3 *)this);
    setLinearLimits(in_stack_00000080,(btConstraintInfo2 *)angVelB,angVelA._4_4_,in_stack_00000068,
                    (btTransform *)this,(btVector3 *)info,in_stack_000000b0,in_stack_000000b8,
                    in_stack_000000c0);
  }
  return;
}

Assistant:

void btGeneric6DofConstraint::getInfo2NonVirtual (btConstraintInfo2* info, const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB)
{
	
	btAssert(!m_useSolveConstraintObsolete);
	//prepare constraint
	calculateTransforms(transA,transB);

	int i;
	for (i=0;i<3 ;i++ )
	{
		testAngularLimitMotor(i);
	}

	if(m_useOffsetForConstraintFrame)
	{ // for stability better to solve angular limits first
		int row = setAngularLimits(info, 0,transA,transB,linVelA,linVelB,angVelA,angVelB);
		setLinearLimits(info, row, transA,transB,linVelA,linVelB,angVelA,angVelB);
	}
	else
	{ // leave old version for compatibility
		int row = setLinearLimits(info, 0, transA,transB,linVelA,linVelB,angVelA,angVelB);
		setAngularLimits(info, row,transA,transB,linVelA,linVelB,angVelA,angVelB);
	}
}